

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  Btree *pBtree;
  MemPage *pPage;
  u8 *pCell;
  Pgno parent;
  ushort uVar2;
  uint uVar3;
  u32 key;
  int iVar4;
  Pgno PVar5;
  int iVar6;
  BtShared *pBVar7;
  u8 *puVar8;
  long lVar9;
  Pgno PVar10;
  uint uVar11;
  void *pvVar12;
  u8 uVar13;
  uint uVar14;
  u64 v;
  ulong uVar15;
  u8 uVar16;
  uint uVar17;
  ulong uVar18;
  uchar *pCell_00;
  u8 *puVar19;
  long in_FS_OFFSET;
  size_t local_c8;
  MemPage *local_90;
  uint *local_88;
  BtreePayload x2;
  int loc;
  uint local_44;
  Pgno local_40;
  int rc;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0xaaaaaaaa;
  pBtree = pCur->pBtree;
  loc = seekResult;
  if ((pCur->curFlags & 0x20) == 0) {
LAB_001499dd:
    if ((pCur->eState < 3) ||
       (uVar3 = moveToRoot(pCur), local_44 = uVar3, (uVar3 & 0xffffffef) == 0)) {
      if (pCur->pKeyInfo == (KeyInfo *)0x0) {
        if (pBtree->hasIncrblobCur != '\0') {
          invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
        }
        if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
          if ((seekResult == 0) &&
             (uVar3 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&loc),
             local_44 = uVar3, uVar3 != 0)) goto LAB_0014a2f7;
        }
        else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            iVar4 = btreeOverwriteCell(pCur,pX);
            return iVar4;
          }
          goto LAB_0014a596;
        }
      }
      else {
        if ((flags & 2U) == 0 && seekResult == 0) {
          if (pX->nMem == 0) {
            uVar3 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&loc);
          }
          else {
            x2.pData = &DAT_aaaaaaaaaaaaaaaa;
            x2.nKey = (sqlite3_int64)pX->aMem;
            x2.aMem = (sqlite3_value *)CONCAT17(0xaa,CONCAT16(0,CONCAT24(pX->nMem,0xaaaaaaaa)));
            x2.nMem = 0xaaaa;
            x2._34_2_ = 0xaa00;
            x2.nData = -0x55555556;
            x2.pKey = pCur->pKeyInfo;
            uVar3 = sqlite3BtreeIndexMoveto(pCur,(UnpackedRecord *)&x2,&loc);
          }
          seekResult = loc;
          local_44 = uVar3;
          if (uVar3 != 0) goto LAB_0014a2f7;
        }
        if (seekResult == 0) {
          getCellInfo(pCur);
          lVar9 = (pCur->info).nKey;
          if (lVar9 == pX->nKey) {
            x2.aMem = (sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa;
            x2.pKey = &DAT_aaaaaaaaaaaaaaaa;
            x2.nKey = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
            x2.pData = pX->pKey;
            x2.nData = (int)lVar9;
            x2._32_4_ = 0xaaaaaaaa;
            x2.nZero = 0;
            x2._44_4_ = 0xaaaaaaaa;
            uVar3 = btreeOverwriteCell(pCur,&x2);
            goto LAB_0014a2f7;
          }
        }
      }
      pPage = pCur->pPage;
      if (-1 < pPage->nFree) {
LAB_00149b61:
        pBVar7 = pBtree->pBt;
        pCell = pBVar7->pTmpSpace;
        if (-1 < (char)(byte)flags) {
          rc = -0x55555556;
          bVar1 = pPage->childPtrSize;
          if (pPage->intKey == '\0') {
            pvVar12 = pX->pKey;
            uVar18 = pX->nKey;
            if ((uint)uVar18 < 0x80) {
              pCell[bVar1] = (u8)uVar18;
              uVar3 = 1;
            }
            else {
              uVar3 = sqlite3PutVarint(pCell + bVar1,(long)(int)(uint)uVar18);
              uVar3 = uVar3 & 0xff;
            }
            iVar4 = uVar3 + bVar1;
            v = uVar18 & 0xffffffff;
          }
          else {
            uVar18 = (ulong)pX->nData;
            v = (long)pX->nZero + uVar18;
            pvVar12 = pX->pData;
            if ((uint)v < 0x80) {
              uVar3 = 1;
              pCell[bVar1] = (u8)v;
            }
            else {
              uVar3 = sqlite3PutVarint(pCell + bVar1,v);
              uVar3 = uVar3 & 0xff;
            }
            uVar3 = uVar3 + bVar1;
            iVar4 = sqlite3PutVarint(pCell + uVar3,pX->nKey);
            iVar4 = iVar4 + uVar3;
          }
          puVar19 = pCell + iVar4;
          iVar6 = (int)v;
          if ((int)(uint)pPage->maxLocal < iVar6) {
            uVar2 = pPage->minLocal;
            pBVar7 = pPage->pBt;
            local_90 = (MemPage *)0x0;
            uVar3 = (iVar6 - (uint)uVar2) % (pBVar7->usableSize - 4) + (uint)uVar2;
            if ((int)(uint)pPage->maxLocal < (int)uVar3) {
              uVar3 = (uint)uVar2;
            }
            local_c8 = (size_t)(uVar3 + 4 + iVar4);
            local_40 = 0;
            local_88 = (uint *)(pCell + (int)(uVar3 + iVar4));
LAB_00149e6f:
            do {
              uVar14 = (uint)v;
              uVar11 = uVar3;
              if ((int)uVar14 < (int)uVar3) {
                uVar11 = uVar14;
              }
              uVar17 = (uint)uVar18;
              if ((int)uVar17 < (int)uVar11) {
                if ((int)uVar17 < 1) {
                  memset(puVar19,0,(long)(int)uVar11);
                }
                else {
                  memcpy(puVar19,pvVar12,uVar18 & 0xffffffff);
                  uVar11 = uVar17;
                }
              }
              else {
                memcpy(puVar19,pvVar12,(long)(int)uVar11);
              }
              parent = local_40;
              iVar4 = sqlite3PendingByte;
              v = (u64)(uVar14 - uVar11);
              if (uVar14 - uVar11 == 0 || (int)uVar14 < (int)uVar11) goto LAB_0014a029;
              puVar19 = puVar19 + (int)uVar11;
              pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar11);
              uVar18 = (ulong)(uVar17 - uVar11);
              uVar3 = uVar3 - uVar11;
              if (uVar3 == 0) {
                x2.pKey = (void *)0x0;
                PVar10 = local_40;
                if (pBVar7->autoVacuum != '\0') {
                  do {
                    do {
                      uVar3 = PVar10;
                      PVar10 = uVar3 + 1;
                      PVar5 = ptrmapPageno(pBVar7,PVar10);
                    } while (PVar10 == PVar5);
                  } while (uVar3 == (uint)iVar4 / pBVar7->pageSize);
                  local_40 = uVar3 + 1;
                }
                uVar3 = allocateBtreePage(pBVar7,(MemPage **)&x2,&local_40,local_40,'\0');
                PVar10 = local_40;
                rc = uVar3;
                if ((pBVar7->autoVacuum == '\0') || (uVar3 != 0)) {
                  if (uVar3 == 0) goto LAB_00149faa;
                }
                else {
                  ptrmapPut(pBVar7,local_40,'\x04' - (parent == 0),parent,&rc);
                  uVar3 = rc;
                  if (rc == 0) {
LAB_00149faa:
                    *local_88 = PVar10 >> 0x18 | (PVar10 & 0xff0000) >> 8 | (PVar10 & 0xff00) << 8 |
                                PVar10 << 0x18;
                    releasePage(local_90);
                    local_90 = (MemPage *)x2.pKey;
                    local_88 = *(uint **)((long)x2.pKey + 0x50);
                    *local_88 = 0;
                    puVar19 = (u8 *)(*(long *)((long)x2.pKey + 0x50) + 4);
                    uVar3 = pBVar7->usableSize - 4;
                    goto LAB_00149e6f;
                  }
                  releasePage((MemPage *)x2.pKey);
                }
                releasePage(local_90);
                goto LAB_0014a2f7;
              }
            } while( true );
          }
          local_c8 = (size_t)(uint)(iVar4 + iVar6);
          if (iVar4 + iVar6 < 4) {
            puVar19[iVar6] = '\0';
            local_c8 = 4;
          }
          iVar4 = (int)uVar18;
          memcpy(puVar19,pvVar12,(long)iVar4);
          memset(puVar19 + iVar4,0,(long)(iVar6 - iVar4));
          goto LAB_0014a038;
        }
        local_44 = 0;
        local_c8 = (size_t)(uint)pBVar7->nPreformatSize;
        if (pBVar7->nPreformatSize < 4) {
          local_c8 = 4;
          pCell[3] = '\0';
          pBVar7 = pBtree->pBt;
        }
        if ((pBVar7->autoVacuum != '\0') && ((uint)pPage->maxLocal < (uint)local_c8)) {
          x2.pData = &DAT_aaaaaaaaaaaaaaaa;
          x2.pKey = &DAT_aaaaaaaaaaaaaaaa;
          x2.nKey = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
          (*pPage->xParseCell)(pPage,pCell,(CellInfo *)&x2);
          if ((uint)x2.pData != x2.pData._4_2_) {
            key = sqlite3Get4byte(pCell + (local_c8 - 4));
            ptrmapPut(pBtree->pBt,key,'\x03',pPage->pgno,(int *)&local_44);
            uVar3 = local_44;
            if (local_44 != 0) goto LAB_0014a2f7;
          }
        }
        goto LAB_0014a05d;
      }
      if (pCur->eState < 2) {
        uVar3 = btreeComputeFreeSpace(pPage);
        local_44 = uVar3;
        if (uVar3 != 0) goto LAB_0014a2f7;
        goto LAB_00149b61;
      }
      iVar4 = 0x13985;
      goto LAB_0014a2ef;
    }
  }
  else {
    uVar3 = saveAllCursors(pBtree->pBt,pCur->pgnoRoot,pCur);
    local_44 = uVar3;
    if (uVar3 == 0) {
      if ((seekResult != 0) && (pCur->iPage < '\0')) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          iVar4 = sqlite3CorruptError(0x1390a);
          return iVar4;
        }
        goto LAB_0014a596;
      }
      goto LAB_001499dd;
    }
  }
  goto LAB_0014a2f7;
LAB_0014a029:
  releasePage(local_90);
LAB_0014a038:
  local_44 = 0;
LAB_0014a05d:
  uVar2 = pCur->ix;
  uVar18 = (ulong)uVar2;
  (pCur->info).nSize = 0;
  if (loc == 0) {
    x2.pData = &DAT_aaaaaaaaaaaaaaaa;
    x2.pKey = &DAT_aaaaaaaaaaaaaaaa;
    x2.nKey = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
    if (uVar2 < pPage->nCell) {
      uVar3 = sqlite3PagerWrite(pPage->pDbPage);
      if (uVar3 != 0) goto LAB_0014a2f7;
      pCell_00 = pPage->aData +
                 (CONCAT11(pPage->aCellIdx[uVar18 * 2],pPage->aCellIdx[uVar18 * 2 + 1]) &
                 pPage->maskPage);
      if (pPage->leaf == '\0') {
        *(undefined4 *)pCell = *(undefined4 *)pCell_00;
      }
      (*pPage->xParseCell)(pPage,pCell_00,(CellInfo *)&x2);
      uVar3 = 0;
      if ((uint)x2.pData != x2.pData._4_2_) {
        uVar3 = clearCellOverflow(pPage,pCell_00,(CellInfo *)&x2);
      }
      pCur->curFlags = pCur->curFlags & 0xfb;
      local_44 = uVar3;
      if ((uint)local_c8 == x2.pData._6_2_) {
        if (((uint)x2.pData == x2.pData._4_2_) &&
           ((pBtree->pBt->autoVacuum == '\0' || ((uint)local_c8 < pPage->minLocal)))) {
          if (pCell_00 < pPage->aData + (ulong)pPage->hdrOffset + 10) {
            iVar4 = 0x139ca;
          }
          else {
            if (pCell_00 + local_c8 <= pPage->aDataEnd) {
              memcpy(pCell_00,pCell,local_c8);
              uVar3 = 0;
              goto LAB_0014a2f7;
            }
            iVar4 = 0x139cd;
          }
          goto LAB_0014a2ef;
        }
      }
      dropCell(pPage,(uint)uVar2,(uint)x2.pData._6_2_,(int *)&local_44);
      uVar3 = local_44;
      if (local_44 == 0) goto LAB_0014a08a;
    }
    else {
      iVar4 = 0x139af;
LAB_0014a2ef:
      uVar3 = sqlite3CorruptError(iVar4);
    }
  }
  else {
    if ((loc < 0) && (pPage->nCell != 0)) {
      pCur->ix = uVar2 + 1;
      uVar18 = (ulong)(ushort)(uVar2 + 1);
      pCur->curFlags = pCur->curFlags & 0xf9;
    }
LAB_0014a08a:
    uVar11 = (uint)local_c8 + 2;
    if (pPage->nFree < (int)uVar11) {
      bVar1 = pPage->nOverflow;
      pPage->nOverflow = bVar1 + 1;
      pPage->apOvfl[bVar1] = pCell;
      pPage->aiOvfl[bVar1] = (u16)uVar18;
      goto LAB_0014a0aa;
    }
    uVar3 = sqlite3PagerWrite(pPage->pDbPage);
    if (uVar3 != 0) goto LAB_0014a26a;
    puVar19 = pPage->aData;
    uVar15 = (ulong)pPage->hdrOffset;
    x2.pKey = (void *)((ulong)x2.pKey & 0xffffffff00000000);
    uVar17 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
    uVar2 = *(ushort *)(puVar19 + uVar15 + 5) << 8 | *(ushort *)(puVar19 + uVar15 + 5) >> 8;
    uVar14 = (uint)uVar2;
    if (uVar2 < uVar17) {
      iVar4 = 0x11bb1;
      if ((uVar14 != 0) || (uVar14 = 0x10000, pPage->pBt->usableSize != 0x10000)) {
LAB_0014a24f:
        uVar3 = sqlite3CorruptError(iVar4);
        goto LAB_0014a26a;
      }
    }
    else {
      iVar4 = 0x11bb4;
      if ((int)pPage->pBt->usableSize < (int)uVar14) goto LAB_0014a24f;
    }
    if (puVar19[uVar15 + 2] == '\0') {
      if ((puVar19[uVar15 + 1] == '\0') || (uVar14 < uVar17 + 2)) goto LAB_0014a409;
LAB_0014a3b5:
      puVar8 = pageFindSlot(pPage,(uint)local_c8,(int *)&x2);
      if (puVar8 == (u8 *)0x0) {
        uVar3 = (uint)x2.pKey;
        if ((uint)x2.pKey == 0) goto LAB_0014a409;
        goto LAB_0014a26a;
      }
      lVar9 = (long)puVar8 - (long)puVar19;
      iVar4 = (int)lVar9;
      if (iVar4 <= (int)uVar17) {
        uVar3 = sqlite3CorruptError(0x11bc5);
        goto LAB_0014a26a;
      }
      uVar16 = (u8)((ulong)lVar9 >> 8);
      uVar13 = (u8)lVar9;
LAB_0014a47f:
      pPage->nFree = pPage->nFree - (uVar11 & 0xffff);
      memcpy(puVar19 + iVar4,pCell,(long)(int)(uint)local_c8);
      puVar8 = pPage->aCellIdx + uVar18 * 2;
      memmove(puVar8 + 2,pPage->aCellIdx + uVar18 * 2,(pPage->nCell - uVar18) * 2);
      *puVar8 = uVar16;
      puVar8[1] = uVar13;
      pPage->nCell = pPage->nCell + 1;
      puVar8 = puVar19 + (ulong)pPage->hdrOffset + 4;
      *puVar8 = *puVar8 + '\x01';
      if (*puVar8 == '\0') {
        puVar19[(ulong)pPage->hdrOffset + 3] = puVar19[(ulong)pPage->hdrOffset + 3] + '\x01';
      }
      if (pPage->pBt->autoVacuum != '\0') {
        x2.pKey = (void *)((ulong)x2.pKey & 0xffffffff00000000);
        ptrmapPutOvflPtr(pPage,pPage,pCell,(int *)&x2);
        uVar3 = (uint)x2.pKey;
        if ((uint)x2.pKey != 0) goto LAB_0014a26a;
      }
LAB_0014a0aa:
      uVar3 = 0;
    }
    else {
      if (uVar17 + 2 <= uVar14) goto LAB_0014a3b5;
LAB_0014a409:
      if ((int)(uVar17 + uVar11) <= (int)uVar14) {
LAB_0014a456:
        iVar4 = uVar14 - (uint)local_c8;
        uVar13 = (u8)iVar4;
        uVar16 = (u8)((uint)iVar4 >> 8);
        *(ushort *)(puVar19 + uVar15 + 5) = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
        goto LAB_0014a47f;
      }
      iVar6 = pPage->nFree - uVar11;
      iVar4 = 4;
      if (iVar6 < 4) {
        iVar4 = iVar6;
      }
      uVar3 = defragmentPage(pPage,iVar4);
      if (uVar3 == 0) {
        uVar14 = (((uint)puVar19[uVar15 + 5] * 0x100 + (uint)puVar19[uVar15 + 6]) - 1 & 0xffff) + 1;
        goto LAB_0014a456;
      }
    }
LAB_0014a26a:
    if (pPage->nOverflow != '\0') {
      pCur->curFlags = pCur->curFlags & 0xf9;
      uVar3 = balance(pCur);
      pCur->pPage->nOverflow = '\0';
      pCur->eState = '\x01';
      if ((uVar3 == 0 & (byte)flags >> 1) == 1) {
        btreeReleaseAllCursorPages(pCur);
        uVar3 = 0;
        if (pCur->pKeyInfo != (KeyInfo *)0x0) {
          pvVar12 = sqlite3Malloc(pX->nKey);
          pCur->pKey = pvVar12;
          if (pvVar12 == (void *)0x0) {
            uVar3 = 7;
          }
          else {
            memcpy(pvVar12,pX->pKey,pX->nKey);
          }
        }
        pCur->eState = '\x03';
        pCur->nKey = pX->nKey;
      }
    }
  }
LAB_0014a2f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar3;
  }
LAB_0014a596:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}